

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O0

tnt_stream * tnt_object_as(tnt_stream *s,char *buf,size_t buf_len)

{
  undefined8 *puVar1;
  tnt_stream_buf *sb;
  size_t buf_len_local;
  char *buf_local;
  tnt_stream *s_local;
  
  buf_local = (char *)s;
  if ((s == (tnt_stream *)0x0) &&
     (buf_local = (char *)tnt_object((tnt_stream *)0x0),
     (tnt_stream *)buf_local == (tnt_stream *)0x0)) {
    s_local = (tnt_stream *)0x0;
  }
  else {
    puVar1 = *(undefined8 **)(buf_local + 0x38);
    *puVar1 = buf;
    puVar1[1] = buf_len;
    puVar1[2] = buf_len;
    *(undefined4 *)(puVar1 + 7) = 1;
    s_local = (tnt_stream *)buf_local;
  }
  return s_local;
}

Assistant:

struct tnt_stream *tnt_object_as(struct tnt_stream *s, char *buf,
				 size_t buf_len)
{
	if (s == NULL) {
		s = tnt_object(s);
		if (s == NULL)
			return NULL;
	}
	struct tnt_stream_buf *sb = TNT_SBUF_CAST(s);

	sb->data = buf;
	sb->size = buf_len;
	sb->alloc = buf_len;
	sb->as = 1;

	return s;
}